

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
ztimer::TimerManager::TimePointValid(TimerManager *this,string *timePoint)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  reference pvVar4;
  match_flag_type *pmVar5;
  ulong in_RDX;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_RDI;
  regex rule;
  vector<int,_std::allocator<int>_> *ans;
  size_t *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  match_flag_type in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *this_00;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [39];
  undefined1 local_49;
  undefined4 local_48;
  undefined1 local_38 [32];
  ulong local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  lVar3 = std::__cxx11::string::size();
  if (lVar3 == 0x13) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (this_00,(char *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
               (flag_type)((ulong)local_38 >> 0x20));
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (in_stack_fffffffffffffeb0,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                       in_stack_fffffffffffffea4);
    if (bVar1) {
      local_49 = 0;
      std::allocator<int>::allocator((allocator<int> *)0x1801b3);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 (allocator_type *)in_stack_fffffffffffffeb0);
      std::allocator<int>::~allocator((allocator<int> *)0x1801d6);
      std::__cxx11::string::substr((ulong)local_70,local_18);
      iVar2 = std::__cxx11::stoi((string *)
                                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                 in_stack_fffffffffffffe98,0);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)this_00,0);
      *pvVar4 = iVar2;
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::substr((ulong)local_90,local_18);
      iVar2 = std::__cxx11::stoi((string *)
                                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                 in_stack_fffffffffffffe98,0);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)this_00,1);
      *pvVar4 = iVar2;
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::substr((ulong)local_b0,local_18);
      iVar2 = std::__cxx11::stoi((string *)
                                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                 in_stack_fffffffffffffe98,0);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)this_00,2);
      *pvVar4 = iVar2;
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::substr((ulong)local_d0,local_18);
      iVar2 = std::__cxx11::stoi((string *)
                                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                 in_stack_fffffffffffffe98,0);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)this_00,3);
      *pvVar4 = iVar2;
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::substr((ulong)local_f0,local_18);
      iVar2 = std::__cxx11::stoi((string *)
                                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                 in_stack_fffffffffffffe98,0);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)this_00,4);
      *pvVar4 = iVar2;
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::substr((ulong)local_110,local_18);
      in_stack_fffffffffffffea4 =
           std::__cxx11::stoi((string *)
                              CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                              in_stack_fffffffffffffe98,0);
      pmVar5 = (match_flag_type *)
               std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)this_00,5);
      *pmVar5 = in_stack_fffffffffffffea4;
      std::__cxx11::string::~string(local_110);
      local_49 = 1;
    }
    else {
      memset(this_00,0,0x18);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x180170);
    }
    local_48 = 1;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  }
  else {
    memset(this_00,0,0x18);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x18010a);
  }
  return (vector<int,_std::allocator<int>_> *)in_RDI;
}

Assistant:

std::vector<int> TimerManager::TimePointValid(const std::string& timePoint)
    {
        // 合法的系统时间点： char timePoint[20] = "xxxx-xx-xx xx:xx:xx";
        if (timePoint.size() != 19) {
            return {};
        }
        std::regex rule(
            "^\\d{4}-((0[1-9])|(1[0-2]))-((0[1-9])|([1-2]\\d)|(3[0-1])) (([0-1]\\d)|(2[0-3]))(:[0-5]\\d){2}$");
        if (regex_match(timePoint, rule) == false) {
            return {};
        }
        std::vector<int> ans(6);
        ans[0] = std::stoi(timePoint.substr(0, 4));   // year
        ans[1] = std::stoi(timePoint.substr(5, 2));   // month
        ans[2] = std::stoi(timePoint.substr(8, 2));   // day
        ans[3] = std::stoi(timePoint.substr(11, 2));  // hour
        ans[4] = std::stoi(timePoint.substr(14, 2));  // minute
        ans[5] = std::stoi(timePoint.substr(17, 2));  // second
        return ans;
    }